

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlXPathObjectPtr xmlXPathConvertBoolean(xmlXPathObjectPtr val)

{
  int val_00;
  xmlXPathObjectPtr pxVar1;
  
  if (val == (xmlXPathObjectPtr)0x0) {
    pxVar1 = xmlXPathNewBoolean(0);
    return pxVar1;
  }
  if (val->type != XPATH_BOOLEAN) {
    val_00 = xmlXPathCastToBoolean(val);
    pxVar1 = xmlXPathNewBoolean(val_00);
    xmlXPathFreeObject(val);
    val = pxVar1;
  }
  return val;
}

Assistant:

xmlXPathObjectPtr
xmlXPathConvertBoolean(xmlXPathObjectPtr val) {
    xmlXPathObjectPtr ret;

    if (val == NULL)
	return(xmlXPathNewBoolean(0));
    if (val->type == XPATH_BOOLEAN)
	return(val);
    ret = xmlXPathNewBoolean(xmlXPathCastToBoolean(val));
    xmlXPathFreeObject(val);
    return(ret);
}